

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O2

TA_RetCode TA_GetLookback(TA_ParamHolder *param,TA_Integer *lookback)

{
  long lVar1;
  code *pcVar2;
  TA_Integer TVar3;
  TA_RetCode TVar4;
  
  if (lookback == (TA_Integer *)0x0 || param == (TA_ParamHolder *)0x0) {
    TVar4 = TA_BAD_PARAM;
  }
  else if (*param->hiddenData == -0x5dfd4dfe) {
    lVar1 = *(long *)((long)param->hiddenData + 0x28);
    if (lVar1 != 0) {
      lVar1 = *(long *)(lVar1 + 0x30);
      TVar4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
      if ((lVar1 != 0) && (pcVar2 = *(code **)(lVar1 + 0x30), pcVar2 != (code *)0x0)) {
        TVar3 = (*pcVar2)();
        *lookback = TVar3;
        TVar4 = TA_SUCCESS;
      }
      return TVar4;
    }
    TVar4 = TA_INVALID_HANDLE;
  }
  else {
    TVar4 = TA_INVALID_PARAM_HOLDER;
  }
  return TVar4;
}

Assistant:

TA_RetCode TA_GetLookback( const TA_ParamHolder *param, TA_Integer *lookback )
{
   const TA_ParamHolderPriv *paramHolderPriv;

   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   TA_FrameLookback lookbackFunction;

   if( (param == NULL) || (lookback == NULL))
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Get the pointer on the lookback function. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   funcDef = (const TA_FuncDef *)funcInfo->handle;
   if( !funcDef ) return TA_INTERNAL_ERROR(2);
   lookbackFunction = funcDef->lookback;
   if( !lookbackFunction ) return TA_INTERNAL_ERROR(2);

   /* Perform the function call. */
   *lookback = (*lookbackFunction)( paramHolderPriv );

   return TA_SUCCESS;
}